

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,float *scaleFactors,int startPattern,int endPattern)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  int j;
  float sum2B;
  float sum1B;
  float sum2A;
  float sum1A;
  float *matrices2Ptr;
  float *matrices1Ptr;
  float *pfStack_50;
  int i;
  float oneOverScaleFactor;
  int k;
  float *destPtr;
  float *partials2Ptr;
  float *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  int stateCountModFour;
  int matrixIncr;
  float *matrices2_local;
  float *partials2_local;
  
  iVar9 = this->kStateCount + 1;
  iVar2 = this->kStateCount;
  for (destPtr._4_4_ = 0; destPtr._4_4_ < this->kCategoryCount; destPtr._4_4_ = destPtr._4_4_ + 1) {
    iVar7 = destPtr._4_4_ * this->kPartialsPaddedStateCount * this->kPatternCount +
            this->kPartialsPaddedStateCount * startPattern;
    iVar8 = destPtr._4_4_ * this->kMatrixSize;
    pfStack_50 = partials1 + iVar7;
    matrices1Ptr = partials2 + iVar7;
    matrices2Ptr = destP + iVar7;
    for (sum1A = (float)startPattern; (int)sum1A < endPattern; sum1A = (float)((int)sum1A + 1)) {
      fVar1 = scaleFactors[(int)sum1A];
      for (sum1B = 0.0; (int)sum1B < this->kStateCount; sum1B = (float)((int)sum1B + 1)) {
        lVar10 = (long)((int)sum1B * iVar9);
        lVar11 = (long)((int)sum1B * iVar9);
        local_84 = 0.0;
        local_88 = 0.0;
        local_8c = 0.0;
        local_90 = 0.0;
        for (local_94 = 0; local_94 < iVar2 / 4 << 2; local_94 = local_94 + 4) {
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfStack_50[local_94]),
                                   ZEXT416((uint)matrices1[(long)iVar8 + lVar10 + local_94]),
                                   ZEXT416((uint)local_84));
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_94]),
                                   ZEXT416((uint)matrices2[(long)iVar8 + lVar11 + local_94]),
                                   ZEXT416((uint)local_88));
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)pfStack_50[local_94 + 1]),
                                   ZEXT416((uint)matrices1[(long)iVar8 + lVar10 + (local_94 + 1)]),
                                   ZEXT416((uint)local_8c));
          auVar6 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_94 + 1]),
                                   ZEXT416((uint)matrices2[(long)iVar8 + lVar11 + (local_94 + 1)]),
                                   ZEXT416((uint)local_90));
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfStack_50[local_94 + 2]),
                                   ZEXT416((uint)matrices1[(long)iVar8 + lVar10 + (local_94 + 2)]),
                                   ZEXT416(auVar3._0_4_));
          local_84 = auVar3._0_4_;
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_94 + 2]),
                                   ZEXT416((uint)matrices2[(long)iVar8 + lVar11 + (local_94 + 2)]),
                                   ZEXT416(auVar4._0_4_));
          local_88 = auVar3._0_4_;
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfStack_50[local_94 + 3]),
                                   ZEXT416((uint)matrices1[(long)iVar8 + lVar10 + (local_94 + 3)]),
                                   ZEXT416(auVar5._0_4_));
          local_8c = auVar3._0_4_;
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_94 + 3]),
                                   ZEXT416((uint)matrices2[(long)iVar8 + lVar11 + (local_94 + 3)]),
                                   ZEXT416(auVar6._0_4_));
          local_90 = auVar3._0_4_;
        }
        for (; local_94 < this->kStateCount; local_94 = local_94 + 1) {
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfStack_50[local_94]),
                                   ZEXT416((uint)matrices1[(long)iVar8 + lVar10 + local_94]),
                                   ZEXT416((uint)local_84));
          local_84 = auVar3._0_4_;
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_94]),
                                   ZEXT416((uint)matrices2[(long)iVar8 + lVar11 + local_94]),
                                   ZEXT416((uint)local_88));
          local_88 = auVar3._0_4_;
        }
        *matrices2Ptr = (local_84 + local_8c) * (local_88 + local_90) * (1.0 / fVar1);
        matrices2Ptr = matrices2Ptr + 1;
      }
      pfStack_50 = pfStack_50 + this->kPartialsPaddedStateCount;
      matrices1Ptr = matrices1Ptr + this->kPartialsPaddedStateCount;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                         const REALTYPE* partials1,
                                                                         const REALTYPE* matrices1,
                                                                         const REALTYPE* partials2,
                                                                         const REALTYPE* matrices2,
                                                                         const REALTYPE* scaleFactors,
                                                                         int startPattern,
                                                                         int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B) * oneOverScaleFactor;
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}